

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_window * nk_find_window(nk_context *ctx,nk_hash hash,char *name)

{
  nk_window *pnVar1;
  int iVar2;
  nk_window **ppnVar3;
  
  ppnVar3 = &ctx->begin;
  do {
    pnVar1 = *ppnVar3;
    if (pnVar1 == (nk_window *)0x0) {
      return (nk_window *)0x0;
    }
    if (pnVar1->name == hash) {
      iVar2 = nk_strlen(pnVar1->name_string);
      iVar2 = nk_stricmpn(pnVar1->name_string,name,iVar2);
      if (iVar2 == 0) {
        return pnVar1;
      }
    }
    ppnVar3 = &pnVar1->next;
  } while( true );
}

Assistant:

NK_INTERN struct nk_window*
nk_find_window(struct nk_context *ctx, nk_hash hash, const char *name)
{
    struct nk_window *iter;
    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        if (iter->name == hash) {
            int max_len = nk_strlen(iter->name_string);
            if (!nk_stricmpn(iter->name_string, name, max_len))
                return iter;
        }
        iter = iter->next;
    }
    return 0;
}